

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompress.hpp
# Opt level: O2

string * __thiscall
gzip::decompress_abi_cxx11_(string *__return_storage_ptr__,gzip *this,char *data,size_t size)

{
  Decompressor decomp;
  Decompressor local_18;
  
  local_18.max_ = 1000000000;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Decompressor::decompress<std::__cxx11::string>
            (&local_18,__return_storage_ptr__,(char *)this,(size_t)data);
  return __return_storage_ptr__;
}

Assistant:

inline std::string decompress(const char *data, std::size_t size) {
        Decompressor decomp;
        std::string output;
        decomp.decompress(output, data, size);
        return output;
    }